

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O3

void asio::detail::
     reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr p;
  handler_work<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor,_void>
  w;
  ptr local_b8;
  any_executor_base local_a0;
  scheduler_operation *local_70;
  undefined1 local_68 [16];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  _Head_base<0UL,_nuraft::asio_rpc_listener_*,_false> local_38;
  scheduler_operation *local_30;
  error_category *peStack_28;
  
  local_b8.h = (_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
                *)&base[4].task_result_;
  local_b8.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
                *)base;
  local_b8.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
                *)base;
  if (owner != (void *)0x0) {
    reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ::do_assign((reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                 *)base);
  }
  execution::detail::any_executor_base::any_executor_base(&local_a0,(any_executor_base *)(base + 7))
  ;
  local_70 = base[9].next_;
  base[9].next_ =
       (scheduler_operation *)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_68._0_8_ = *(undefined8 *)&base[4].task_result_;
  local_68._8_8_ = base[5].next_;
  local_b8.h = (_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
                *)local_68;
  local_58 = (element_type *)base[5].func_;
  _Stack_50._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&base[5].task_result_;
  *(undefined8 *)&base[5].task_result_ = 0;
  base[5].func_ = (func_type)0x0;
  local_48 = (element_type *)base[6].next_;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[6].func_;
  base[6].func_ = (func_type)0x0;
  base[6].next_ = (scheduler_operation *)0x0;
  local_38._M_head_impl = *(asio_rpc_listener **)&base[6].task_result_;
  local_30 = base[1].next_;
  peStack_28 = (error_category *)base[1].func_;
  ptr::reset(&local_b8);
  if (owner != (void *)0x0) {
    handler_work<std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,std::error_code>>
              ((handler_work<std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,asio::any_io_executor,void>
                *)&local_a0,
               (binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>
                *)local_68,
               (_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
                *)local_68);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  (*(local_a0.object_fns_)->destroy)(&local_a0);
  ptr::reset(&local_b8);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_accept_op* o(static_cast<reactive_socket_accept_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    // On success, assign new connection to peer socket object.
    if (owner)
      o->do_assign();

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(o->handler_, o->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }